

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

unsigned_long_long QUtil::string_to_ull(char *str)

{
  byte bVar1;
  byte *pbVar2;
  int *piVar3;
  ulonglong uVar4;
  runtime_error *prVar5;
  long *plVar6;
  long *plVar7;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pbVar2 = (byte *)str;
  while( true ) {
    bVar1 = *pbVar2;
    if ((4 < bVar1 - 9) && (bVar1 != 0x20)) break;
    pbVar2 = pbVar2 + 1;
  }
  if (bVar1 != 0x2d) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    uVar4 = strtoull(str,(char **)0x0,10);
    if (*piVar3 != 0x22) {
      return uVar4;
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"overflow converting ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
    local_70 = (long *)*plVar6;
    plVar7 = plVar6 + 2;
    if (local_70 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = plVar6[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
    }
    local_68 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (long *)*plVar6;
    plVar7 = plVar6 + 2;
    if (local_50 == plVar7) {
      local_40 = *plVar7;
      lStack_38 = plVar6[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar7;
    }
    local_48 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::runtime_error::runtime_error(prVar5,(string *)&local_50);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"underflow converting ","");
  plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
  local_70 = (long *)*plVar6;
  plVar7 = plVar6 + 2;
  if (local_70 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar6[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (long *)*plVar6;
  plVar7 = plVar6 + 2;
  if (local_50 == plVar7) {
    local_40 = *plVar7;
    lStack_38 = plVar6[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar7;
  }
  local_48 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::runtime_error::runtime_error(prVar5,(string *)&local_50);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unsigned long long
QUtil::string_to_ull(char const* str)
{
    char const* p = str;
    while (*p && util::is_space(*p)) {
        ++p;
    }
    if (*p == '-') {
        throw std::runtime_error(
            std::string("underflow converting ") + str + " to 64-bit unsigned integer");
    }

    errno = 0;
#ifdef _MSC_VER
    unsigned long long result = _strtoui64(str, 0, 10);
#else
    unsigned long long result = strtoull(str, nullptr, 10);
#endif
    if (errno == ERANGE) {
        throw std::runtime_error(
            std::string("overflow converting ") + str + " to 64-bit unsigned integer");
    }
    return result;
}